

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestRequiredMessageMap::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  TestRequiredMessageMap **v1;
  TestRequiredMessageMap **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestRequiredMessageMap *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestRequiredMessageMap *from;
  TestRequiredMessageMap *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestRequiredMessageMap *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestRequiredMessageMap *)to_msg;
  _this = (TestRequiredMessageMap *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestRequiredMessageMap_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestRequiredMessageMap*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestRequiredMessageMap_const*,proto2_unittest::TestRequiredMessageMap*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/map_unittest.pb.cc"
               ,0x222c,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  google::protobuf::internal::TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired>::MergeFrom
            ((TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired> *)&(from->field_0)._impl_,
             (TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired> *)
             (absl_log_internal_check_op_result + 0x10));
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestRequiredMessageMap::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRequiredMessageMap*>(&to_msg);
  auto& from = static_cast<const TestRequiredMessageMap&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRequiredMessageMap)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_field_.MergeFrom(from._impl_.map_field_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}